

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

Opnd * __thiscall
Lowerer::GetForInEnumeratorFieldOpnd
          (Lowerer *this,Opnd *forInEnumeratorOpnd,uint fieldOffset,IRType type)

{
  code *pcVar1;
  bool bVar2;
  int32 iVar3;
  SymOpnd *this_00;
  StackSym *sym;
  undefined4 *puVar4;
  IndirOpnd *this_01;
  RegOpnd *baseOpnd;
  IndirOpnd *indirOpnd;
  SymOpnd *symOpnd;
  IRType type_local;
  uint fieldOffset_local;
  Opnd *forInEnumeratorOpnd_local;
  Lowerer *this_local;
  
  bVar2 = IR::Opnd::IsSymOpnd(forInEnumeratorOpnd);
  if (bVar2) {
    this_00 = IR::Opnd::AsSymOpnd(forInEnumeratorOpnd);
    sym = IR::Opnd::GetStackSym(&this_00->super_Opnd);
    this_local = (Lowerer *)
                 IR::SymOpnd::New(&sym->super_Sym,this_00->m_offset + fieldOffset,type,this->m_func)
    ;
  }
  else {
    bVar2 = IR::Opnd::IsIndirOpnd(forInEnumeratorOpnd);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x2704,"(forInEnumeratorOpnd->IsIndirOpnd())",
                         "forInEnumeratorOpnd->IsIndirOpnd()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    this_01 = IR::Opnd::AsIndirOpnd(forInEnumeratorOpnd);
    baseOpnd = IR::IndirOpnd::GetBaseOpnd(this_01);
    iVar3 = IR::IndirOpnd::GetOffset(this_01);
    this_local = (Lowerer *)IR::IndirOpnd::New(baseOpnd,iVar3 + fieldOffset,type,this->m_func,false)
    ;
  }
  return (Opnd *)this_local;
}

Assistant:

IR::Opnd *
Lowerer::GetForInEnumeratorFieldOpnd(IR::Opnd * forInEnumeratorOpnd, uint fieldOffset, IRType type)
{
    if (forInEnumeratorOpnd->IsSymOpnd())
    {
        IR::SymOpnd * symOpnd = forInEnumeratorOpnd->AsSymOpnd();
        return IR::SymOpnd::New(symOpnd->GetStackSym(), symOpnd->m_offset + fieldOffset, type, this->m_func);
    }
    Assert(forInEnumeratorOpnd->IsIndirOpnd());
    IR::IndirOpnd * indirOpnd = forInEnumeratorOpnd->AsIndirOpnd();
    return IR::IndirOpnd::New(indirOpnd->GetBaseOpnd(), indirOpnd->GetOffset() + fieldOffset, type, this->m_func);
}